

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::ServiceDescriptorProto::Clear(ServiceDescriptorProto *this)

{
  uint uVar1;
  string *psVar2;
  LogMessage *pLVar3;
  LogFinisher local_89;
  LogMessage local_88;
  LogMessage local_50;
  
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<google::protobuf::MethodDescriptorProto>::TypeHandler>
            (&(this->method_).super_RepeatedPtrFieldBase);
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      if ((this->name_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x1b69);
        pLVar3 = internal::LogMessage::operator<<
                           (&local_50,
                            "CHECK failed: !name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar3);
        internal::LogMessage::~LogMessage(&local_50);
      }
      psVar2 = (this->name_).ptr_;
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
    }
    if (((this->_has_bits_).has_bits_[0] & 2) != 0) {
      if (this->options_ == (ServiceOptions *)0x0) {
        internal::LogMessage::LogMessage
                  (&local_88,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x1b6d);
        pLVar3 = internal::LogMessage::operator<<(&local_88,"CHECK failed: options_ != NULL: ");
        internal::LogFinisher::operator=(&local_89,pLVar3);
        internal::LogMessage::~LogMessage(&local_88);
      }
      ServiceOptions::Clear(this->options_);
    }
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void ServiceDescriptorProto::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.ServiceDescriptorProto)
  method_.Clear();
  if (_has_bits_[0 / 32] & 3u) {
    if (has_name()) {
      GOOGLE_DCHECK(!name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*name_.UnsafeRawStringPointer())->clear();
    }
    if (has_options()) {
      GOOGLE_DCHECK(options_ != NULL);
      options_->::google::protobuf::ServiceOptions::Clear();
    }
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}